

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall
DStrobe::DStrobe(DStrobe *this,sector_t *sector,int upper,int lower,int utics,int ltics)

{
  short sVar1;
  int ltics_local;
  int utics_local;
  int lower_local;
  int upper_local;
  sector_t *sector_local;
  DStrobe *this_local;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_009f79f8;
  this->m_DarkTime = ltics;
  this->m_BrightTime = utics;
  sVar1 = sector_t::ClampLight(upper);
  this->m_MaxLight = (int)sVar1;
  sVar1 = sector_t::ClampLight(lower);
  this->m_MinLight = (int)sVar1;
  this->m_Count = 1;
  return;
}

Assistant:

DStrobe::DStrobe (sector_t *sector, int upper, int lower, int utics, int ltics)
	: DLighting (sector)
{
	m_DarkTime = ltics;
	m_BrightTime = utics;
	m_MaxLight = sector_t::ClampLight(upper);
	m_MinLight = sector_t::ClampLight(lower);
	m_Count = 1;	// Hexen-style is always in sync
}